

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O3

void __thiscall
TPZFMatrix<long_double>::GramSchmidt
          (TPZFMatrix<long_double> *this,TPZFMatrix<long_double> *Orthog,
          TPZFMatrix<long_double> *TransfToOrthog)

{
  long lVar1;
  longdouble *plVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  undefined8 in_R8;
  undefined8 in_R9;
  long lVar12;
  int64_t stop;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  longdouble in_ST0;
  longdouble lVar17;
  longdouble lVar18;
  longdouble lVar19;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  longdouble in_ST6;
  longdouble in_ST7;
  double dVar20;
  longdouble local_b8;
  longdouble local_9c;
  double local_78;
  long local_68;
  
  if ((this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol < 1) {
    local_78 = 1.0;
  }
  else {
    lVar9 = 0;
    local_78 = 1.0;
    do {
      dVar20 = 0.0;
      if (0 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow) {
        lVar14 = 0;
        lVar17 = in_ST0;
        lVar18 = in_ST1;
        lVar19 = in_ST2;
        lVar3 = in_ST3;
        lVar4 = in_ST4;
        lVar5 = in_ST5;
        in_ST5 = in_ST7;
        do {
          in_ST4 = in_ST6;
          in_ST3 = lVar5;
          in_ST2 = lVar4;
          in_ST1 = lVar3;
          in_ST0 = lVar19;
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar14,lVar9);
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar14,lVar9);
          dVar20 = dVar20 + ABS((double)(lVar17 * lVar18));
          lVar14 = lVar14 + 1;
          lVar17 = in_ST0;
          lVar18 = in_ST1;
          lVar19 = in_ST2;
          lVar3 = in_ST3;
          lVar4 = in_ST4;
          lVar5 = in_ST5;
          in_ST6 = in_ST5;
          in_ST7 = in_ST5;
        } while (lVar14 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow);
      }
      if (dVar20 < 0.0) {
        dVar20 = sqrt(dVar20);
      }
      else {
        dVar20 = SQRT(dVar20);
      }
      if ((1e-10 < dVar20) && (local_78 < 1.0 / dVar20)) {
        local_78 = 1.0 / dVar20;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol);
  }
  lVar18 = (longdouble)local_78;
  lVar17 = in_ST6;
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x26]
  )(this);
  lVar9 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
  lVar14 = (this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
  (*(Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xd])(Orthog,lVar9);
  (*(Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0xf])(Orthog);
  if (0 < lVar9) {
    lVar10 = 0;
    do {
      if (0 < lVar14) {
        lVar11 = 0;
        lVar19 = in_ST0;
        lVar3 = in_ST1;
        lVar4 = in_ST2;
        lVar5 = in_ST3;
        lVar6 = in_ST4;
        lVar7 = in_ST5;
        lVar8 = in_ST6;
        in_ST6 = lVar17;
        do {
          in_ST5 = lVar8;
          in_ST4 = lVar7;
          in_ST3 = lVar6;
          in_ST2 = lVar5;
          in_ST1 = lVar4;
          in_ST0 = lVar3;
          (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(this,lVar10,lVar11);
          lVar13 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          if ((lVar13 <= lVar10) ||
             ((Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar11)) {
            Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          Orthog->fElem[lVar13 * lVar11 + lVar10] = lVar19;
          lVar11 = lVar11 + 1;
          lVar19 = in_ST0;
          lVar3 = in_ST1;
          lVar4 = in_ST2;
          lVar5 = in_ST3;
          lVar6 = in_ST4;
          lVar7 = in_ST5;
          lVar8 = in_ST6;
          lVar17 = in_ST6;
        } while (lVar14 != lVar11);
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar9);
  }
  if (1 < lVar14) {
    lVar10 = 1;
    local_68 = 0x10;
    do {
      lVar11 = 0;
      lVar13 = 0;
      do {
        if (0 < lVar9) {
          lVar12 = 0;
          lVar15 = 0;
          local_b8 = (longdouble)0;
          lVar17 = in_ST0;
          lVar19 = in_ST1;
          lVar3 = in_ST2;
          lVar4 = in_ST3;
          lVar5 = in_ST4;
          local_9c = local_b8;
          do {
            in_ST4 = in_ST5;
            in_ST3 = lVar5;
            in_ST2 = lVar4;
            in_ST1 = lVar3;
            in_ST0 = lVar19;
            in_ST5 = in_ST4;
            (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0x24])(this,lVar15,lVar10);
            lVar16 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            lVar1 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
            if (lVar1 <= lVar13 || lVar16 <= lVar15) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            plVar2 = Orthog->fElem;
            local_9c = local_9c + *(longdouble *)((long)plVar2 + lVar12 + lVar11 * lVar16) * lVar17;
            if (lVar1 <= lVar13 || lVar16 <= lVar15) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            if ((lVar16 <= lVar15) || (lVar1 <= lVar13)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_b8 = local_b8 +
                       *(longdouble *)((long)plVar2 + lVar12 + lVar16 * lVar13 * 0x10) *
                       *(longdouble *)((long)plVar2 + lVar12 + lVar16 * lVar13 * 0x10);
            lVar15 = lVar15 + 1;
            lVar12 = lVar12 + 0x10;
            lVar17 = in_ST0;
            lVar19 = in_ST1;
            lVar3 = in_ST2;
            lVar4 = in_ST3;
            lVar5 = in_ST4;
          } while (lVar9 != lVar15);
          if ((longdouble)1e-08 <= ABS(local_b8)) {
            if (0 < lVar9) {
              lVar12 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
              lVar16 = 0;
              lVar15 = 0;
              do {
                lVar1 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
                if (lVar1 <= lVar13 || lVar12 <= lVar15) {
                  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                plVar2 = Orthog->fElem;
                if ((lVar12 <= lVar15) || (lVar1 <= lVar10)) {
                  Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                  pzinternal::DebugStopImpl
                            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                             ,0x26d);
                }
                *(longdouble *)((long)plVar2 + lVar16 + local_68 * lVar12) =
                     *(longdouble *)((long)plVar2 + lVar16 + local_68 * lVar12) -
                     (local_9c * *(longdouble *)((long)plVar2 + lVar16 + lVar11 * lVar12)) /
                     local_b8;
                lVar15 = lVar15 + 1;
                lVar16 = lVar16 + 0x10;
              } while (lVar9 != lVar15);
            }
          }
          else if (0 < lVar9) {
            lVar12 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            lVar16 = 0;
            lVar15 = 0;
            do {
              if ((lVar12 <= lVar15) ||
                 ((Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar13)) {
                Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(longdouble *)((long)Orthog->fElem + lVar16 + lVar11 * lVar12) = (longdouble)0;
              lVar15 = lVar15 + 1;
              lVar16 = lVar16 + 0x10;
            } while (lVar9 != lVar15);
          }
        }
        lVar13 = lVar13 + 1;
        lVar11 = lVar11 + 0x10;
      } while (lVar13 != lVar10);
      lVar10 = lVar10 + 1;
      local_68 = local_68 + 0x10;
    } while (lVar10 != lVar14);
  }
  if (0 < lVar14) {
    lVar11 = 0;
    lVar10 = 0;
    do {
      if (0 < lVar9) {
        lVar13 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
        lVar12 = 0;
        lVar15 = 0;
        local_b8 = (longdouble)0;
        do {
          lVar16 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol;
          if (lVar16 <= lVar10 || lVar13 <= lVar15) {
            Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          if ((lVar13 <= lVar15) || (lVar16 <= lVar10)) {
            Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          local_b8 = local_b8 +
                     *(longdouble *)((long)Orthog->fElem + lVar12 + lVar13 * lVar10 * 0x10) *
                     *(longdouble *)((long)Orthog->fElem + lVar12 + lVar11 * lVar13);
          lVar15 = lVar15 + 1;
          lVar12 = lVar12 + 0x10;
        } while (lVar9 != lVar15);
        if (ABS(local_b8) <= (longdouble)1e-08) {
          if (0 < lVar9) {
            lVar13 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            lVar12 = 0;
            lVar15 = 0;
            do {
              if ((lVar13 <= lVar15) ||
                 ((Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar10)) {
                Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
                pzinternal::DebugStopImpl
                          ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                           ,0x26d);
              }
              *(longdouble *)((long)Orthog->fElem + lVar12 + lVar11 * lVar13) = (longdouble)0;
              lVar15 = lVar15 + 1;
              lVar12 = lVar12 + 0x10;
            } while (lVar9 != lVar15);
          }
        }
        else if (0 < lVar9) {
          lVar13 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
          lVar12 = 0;
          lVar15 = 0;
          lVar17 = in_ST0;
          lVar19 = in_ST1;
          lVar3 = in_ST2;
          lVar4 = in_ST3;
          lVar5 = in_ST4;
          do {
            in_ST4 = in_ST5;
            in_ST3 = lVar5;
            in_ST2 = lVar4;
            in_ST1 = lVar3;
            in_ST0 = lVar19;
            if ((lVar13 <= lVar15) ||
               ((Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar10)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar19 = *(longdouble *)((long)Orthog->fElem + lVar12 + lVar13 * lVar11);
            in_ST5 = in_ST4;
            lVar18 = local_b8;
            sqrtl();
            lVar13 = (Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fRow;
            if ((lVar13 <= lVar15) ||
               ((Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.fCol <= lVar10)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            *(longdouble *)((long)Orthog->fElem + lVar12 + lVar11 * lVar13) = lVar19 / lVar17;
            lVar15 = lVar15 + 1;
            lVar12 = lVar12 + 0x10;
            lVar17 = in_ST0;
            lVar19 = in_ST1;
            lVar3 = in_ST2;
            lVar4 = in_ST3;
            lVar5 = in_ST4;
          } while (lVar9 != lVar15);
        }
      }
      lVar10 = lVar10 + 1;
      lVar11 = lVar11 + 0x10;
    } while (lVar10 != lVar14);
  }
  (*(Orthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
    [0x25])(Orthog,this,TransfToOrthog,1,in_R8,in_R9,lVar18);
  (*(this->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x26]
  )(this);
  (*(TransfToOrthog->super_TPZMatrix<long_double>).super_TPZBaseMatrix.super_TPZSavable.
    _vptr_TPZSavable[0x26])(TransfToOrthog);
  return;
}

Assistant:

void TPZFMatrix<TVar>::GramSchmidt(TPZFMatrix<TVar> &Orthog, TPZFMatrix<TVar> &TransfToOrthog)
{
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value||
                  std::is_same<TVar,int>::value||
                  std::is_same<TVar,TPZFlopCounter>::value) {
        PZError<<__PRETTY_FUNCTION__;
        PZError<<" not implemented for this type\n";
        PZError<<"Aborting...";
        DebugStop();
    }
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        Print("GrSchmidt Entrada",sout);
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
    double scale = 1.;
    for(int64_t j = 0; j < this->Cols(); j++)
    {
        double norm = 0.;
        for(int64_t i = 0; i < this->Rows(); i++)
        {
            norm += fabs(TPZExtractVal::val(this->GetVal(i,j)*this->GetVal(i,j)));
        }
        norm = sqrt(norm);
        if(norm > 1.e-10)
        {
            if((1.)/norm > scale) scale = (1.)/norm;
        }
    }
    
    this->operator *=( scale );
    
    int64_t QTDcomp = this->Rows();
    int64_t QTDvec = this->Cols();
    Orthog.Resize(QTDcomp,QTDvec);
    Orthog.Zero();
    /// Making a copy of *this (Ortog = *this)
    for(int64_t r = 0; r < QTDcomp; r++)
    {
        for(int64_t c = 0; c < QTDvec; c++)
        {
            Orthog(r,c) = GetVal(r,c);
        }
    }
    
#ifdef PZDEBUG
    int check = 0;
    for(int64_t c = 0; c < QTDvec; c++)
    {
        TVar summ = 0.;
        for(int64_t r = 0; r < QTDcomp; r++)
        {
            summ += fabs(GetVal(r,c));
        }
        if(fabs(summ) < 0.00001)
        {
            std::stringstream sout;
            sout << "Null Vector on Gram-Schmidt Method! Col = " << c << "\n";
            LOGPZ_ERROR(logger,sout.str())
            check = 1;
        }
    }
#endif
    
    TVar dotUp, dotDown;
    for(int64_t c = 1; c < QTDvec; c++)
    {
        for(int64_t stop = 0; stop < c; stop++)
        {
            dotUp = 0.;
            dotDown = 0.;
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                dotUp += GetVal(r,c)*Orthog(r,stop);
                dotDown += Orthog(r,stop)*Orthog(r,stop);
            }
            if(fabs(dotDown) < 1.E-8)
            {
#ifdef PZDEBUG
                if(check == 0)
                {
                    std::stringstream sout;
                    sout << "Parallel Vectors on Gram-Schmidt Method! Col = " << stop << "\n";
                    LOGPZ_ERROR(logger,sout.str())
                }
#endif
                
                for(int64_t r = 0; r < QTDcomp; r++)
                {
                    Orthog(r,stop) = 0.;
                }
            }
            else
            {
#ifdef PZ_LOG2
                if (logger.isDebugEnabled())
                {
                    std::stringstream sout;
                    sout << "dotdown = " << dotDown << " dotup = " << dotUp;
                    LOGPZ_DEBUG(logger,sout.str())
                }
#endif
                
                for(int64_t r = 0; r < QTDcomp; r++)
                {
                    Orthog(r,c) -= dotUp*Orthog(r,stop)/dotDown;
                }
            }
        }
    }
    for(int64_t c = 0; c < QTDvec; c++)
    {
        dotUp = 0.;
        for(int64_t r = 0; r < QTDcomp; r++)
        {
            dotUp += Orthog(r,c)*Orthog(r,c);
        }
        if(fabs(dotUp) > 1.e-8)
        {
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                Orthog(r,c) = Orthog(r,c)/sqrt(dotUp);
            }
        }
        else {
#ifdef PZ_LOG
            std::stringstream sout;
            sout << "Linearly dependent columns dotUp = " << dotUp;
            LOGPZ_ERROR(logger,sout.str())
#endif
            
            for(int64_t r = 0; r < QTDcomp; r++)
            {
                Orthog(r,c) = 0.;
            }
        }
        
    }
    Orthog.Multiply(*this,TransfToOrthog,1);
    
    this->operator*= ( 1./scale );
    TransfToOrthog.operator*= ( 1./scale );
    
#ifdef PZ_LOG2
    if (logger.isDebugEnabled())
    {
        std::stringstream sout;
        sout << endl;
        sout << "Output GS" << endl;
        Orthog.Print("Orthog matrix",sout);
        TransfToOrthog.Print("TransfToOrthog matrix",sout);
        LOGPZ_DEBUG(logger,sout.str())
    }
#endif
    
#ifdef PZDEBUG
    TPZFNMatrix<9, TVar> OrthogT;
    Orthog.Transpose(&OrthogT);
    TPZAxesTools<TVar>::VerifyAxes(OrthogT);
#endif
}